

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quickjs.c
# Opt level: O0

JSValue js_call_c_function(JSContext *ctx,JSValue func_obj,JSValue this_obj,int argc,JSValue *argv,
                          int flags)

{
  short sVar1;
  JSRuntime *pJVar2;
  code *pcVar3;
  int64_t iVar4;
  JSValue JVar5;
  JSValue *pJVar6;
  BOOL BVar7;
  int iVar8;
  JSValue *pJVar9;
  JSValueUnion JVar10;
  double dVar11;
  JSValue JVar12;
  size_t in_stack_fffffffffffffd18;
  JSRuntime *in_stack_fffffffffffffd20;
  JSContext *ctx_00;
  int local_2a4 [2];
  int done;
  uint uStack_28c;
  uint uStack_27c;
  undefined8 local_270;
  double d2;
  double d1_1;
  uint uStack_24c;
  undefined8 local_240;
  double d1;
  undefined4 local_1e8;
  uint uStack_1e4;
  undefined8 local_1e0;
  undefined4 local_1c8;
  uint uStack_1c4;
  undefined8 local_1c0;
  undefined4 local_1a8;
  uint uStack_1a4;
  undefined8 local_1a0;
  uint local_194;
  int local_190;
  JSCFunctionEnum cproto;
  int i;
  int arg_count;
  JSValue *arg_buf;
  JSValue ret_val;
  JSStackFrame *prev_sf;
  JSStackFrame *sf;
  JSStackFrame sf_s;
  JSObject *p;
  JSCFunctionType func;
  JSRuntime *rt;
  int argc_local;
  JSContext *ctx_local;
  JSValue this_obj_local;
  JSValue func_obj_local;
  JSValueUnion local_b8;
  JSValueUnion local_b0;
  undefined4 uStack_a4;
  anon_union_8_2_94730072 t_1;
  anon_union_8_2_94730072 u_1;
  int32_t val_1;
  JSValueUnion local_70;
  JSValue v_1;
  JSValueUnion local_58;
  undefined4 uStack_4c;
  anon_union_8_2_94730072 t;
  anon_union_8_2_94730072 u;
  int32_t val;
  JSValueUnion local_18;
  JSValue v;
  
  this_obj_local.u = (JSValueUnion)this_obj.tag;
  ctx_local = (JSContext *)this_obj.u;
  JVar10 = func_obj.u;
  pJVar9 = (JSValue *)&stack0xfffffffffffffd18;
  pJVar2 = ctx->rt;
  local_194 = (uint)*(byte *)((long)JVar10.ptr + 0x41);
  cproto = (JSCFunctionEnum)*(byte *)((long)JVar10.ptr + 0x40);
  sf_s.cur_sp = (JSValue *)JVar10;
  BVar7 = js_check_stack_overflow(in_stack_fffffffffffffd20,in_stack_fffffffffffffd18);
  if (BVar7 != 0) {
    JVar12 = JS_ThrowStackOverflow((JSContext *)0x11c7b4);
    return JVar12;
  }
  ret_val.tag = (int64_t)pJVar2->current_stack_frame;
  sf = pJVar2->current_stack_frame;
  pJVar2->current_stack_frame = (JSStackFrame *)&sf;
  ctx_00 = (JSContext *)sf_s.cur_sp[3].u.ptr;
  sf_s.cur_pc._4_4_ = 0;
  sf_s.prev_frame = (JSStackFrame *)JVar10.ptr;
  sf_s.cur_func.u = (JSValueUnion)func_obj.tag;
  sf_s.cur_pc._0_4_ = argc;
  _i = argv;
  if (argc < (int)cproto) {
    pJVar9 = (JSValue *)(&stack0xfffffffffffffd18 + (long)(int)cproto * -0x10);
    _i = pJVar9;
    for (local_190 = 0; local_190 < argc; local_190 = local_190 + 1) {
      pJVar9[local_190].u = argv[local_190].u;
      pJVar9[local_190].tag = argv[local_190].tag;
    }
    for (local_190 = argc; local_190 < (int)cproto; local_190 = local_190 + 1) {
      local_1a8 = 0;
      local_1a0 = 3;
      pJVar9[local_190].u.ptr = (void *)((ulong)uStack_1a4 << 0x20);
      pJVar9[local_190].tag = 3;
    }
    sf_s.cur_pc._0_4_ = cproto;
  }
  pJVar6 = _i;
  sf_s.cur_func.tag = (int64_t)_i;
  pcVar3 = (code *)sf_s.cur_sp[3].tag;
  switch(local_194) {
  case 2:
  case 4:
    if ((flags & 1U) == 0) {
      if (local_194 == 2) {
LAB_0011c9dd:
        pJVar9[-1].tag = 0x11c9f2;
        JVar12 = JS_ThrowTypeError(ctx_00,"must be called with new");
        break;
      }
      local_1c8 = 0;
      local_1c0 = 3;
      ctx_local = (JSContext *)((ulong)uStack_1c4 << 0x20);
      this_obj_local.u.float64 = 1.48219693752374e-323;
    }
  case 0:
    pJVar9[-1].tag = 0x11ca81;
    JVar12 = (JSValue)(*pcVar3)(ctx_00,ctx_local,this_obj_local.u.float64,argc,pJVar6);
    break;
  case 3:
  case 5:
    if ((flags & 1U) == 0) {
      if (local_194 == 3) goto LAB_0011c9dd;
      local_1e8 = 0;
      local_1e0 = 3;
      ctx_local = (JSContext *)((ulong)uStack_1e4 << 0x20);
      this_obj_local.u.float64 = 1.48219693752374e-323;
    }
  case 1:
    sVar1 = *(short *)((long)&sf_s.cur_sp[4].u + 2);
    pJVar9[-1].tag = 0x11cb35;
    JVar12 = (JSValue)(*pcVar3)(ctx_00,ctx_local,this_obj_local.u.float64,argc,pJVar6,(int)sVar1);
    break;
  case 6:
    pJVar9[-1].tag = 0x11ccec;
    iVar8 = JS_ToFloat64((JSContext *)pJVar9[2].tag,(double *)pJVar9[2].u.ptr,pJVar9[3]);
    if (iVar8 == 0) {
      pJVar9[-1].tag = 0x11cd58;
      dVar11 = (double)(*pcVar3)(local_240);
      if (dVar11 == (double)(int)dVar11) {
        local_18._4_4_ = uStack_4c;
        local_18.int32 = (int)dVar11;
        v.u.float64 = 0.0;
      }
      else {
        pJVar9[-1].tag = 0x11cdbc;
        JVar12 = __JS_NewFloat64(ctx_00,dVar11);
        v_1.tag = (int64_t)JVar12.u;
        local_18 = (JSValueUnion)v_1.tag;
        local_58 = (JSValueUnion)JVar12.tag;
        v.u = local_58;
      }
      JVar12.tag = (int64_t)v.u.ptr;
      JVar12.u.float64 = local_18.float64;
    }
    else {
      JVar12.tag = 6;
      JVar12.u.ptr = (void *)((ulong)uStack_24c << 0x20);
    }
    break;
  case 7:
    pJVar9[-1].tag = 0x11ce2c;
    iVar8 = JS_ToFloat64((JSContext *)pJVar9[2].tag,(double *)pJVar9[2].u.ptr,pJVar9[3]);
    if (iVar8 == 0) {
      pJVar9[-1].tag = 0x11ce9b;
      iVar8 = JS_ToFloat64((JSContext *)pJVar9[2].tag,(double *)pJVar9[2].u.ptr,pJVar9[3]);
      if (iVar8 == 0) {
        pJVar9[-1].tag = 0x11cf0f;
        dVar11 = (double)(*pcVar3)(d2,local_270);
        if (dVar11 == (double)(int)dVar11) {
          local_70._4_4_ = uStack_a4;
          local_70.int32 = (int)dVar11;
          v_1.u.float64 = 0.0;
        }
        else {
          pJVar9[-1].tag = 0x11cf8b;
          JVar12 = __JS_NewFloat64(ctx_00,dVar11);
          local_b8 = JVar12.u;
          local_70 = local_b8;
          local_b0 = (JSValueUnion)JVar12.tag;
          v_1.u = local_b0;
        }
        JVar12.tag = (int64_t)v_1.u.ptr;
        JVar12.u.float64 = local_70.float64;
      }
      else {
        JVar12.tag = 6;
        JVar12.u.ptr = (void *)((ulong)uStack_28c << 0x20);
      }
    }
    else {
      JVar12.tag = 6;
      JVar12.u.ptr = (void *)((ulong)uStack_27c << 0x20);
    }
    break;
  case 8:
    pJVar9[-1].tag = 0x11cb82;
    JVar12 = (JSValue)(*pcVar3)(ctx_00,ctx_local,this_obj_local.u.float64);
    break;
  case 9:
    dVar11 = (_i->u).float64;
    iVar4 = _i->tag;
    pJVar9[-1].tag = 0x11cbdd;
    JVar12 = (JSValue)(*pcVar3)(ctx_00,ctx_local,this_obj_local.u.float64,dVar11,iVar4);
    break;
  case 10:
    sVar1 = *(short *)((long)&sf_s.cur_sp[4].u + 2);
    pJVar9[-1].tag = 0x11cc35;
    JVar12 = (JSValue)(*pcVar3)(ctx_00,ctx_local,this_obj_local.u.float64,(int)sVar1);
    break;
  case 0xb:
    sVar1 = *(short *)((long)&sf_s.cur_sp[4].u + 2);
    dVar11 = (_i->u).float64;
    iVar4 = _i->tag;
    pJVar9[-1].tag = 0x11cc9c;
    JVar12 = (JSValue)(*pcVar3)(ctx_00,ctx_local,this_obj_local.u.float64,dVar11,iVar4,(int)sVar1);
    break;
  case 0xc:
    *(int *)&pJVar9[-1].u = (int)*(short *)((long)&sf_s.cur_sp[4].u + 2);
    pJVar9[-2].tag = 0x11d02c;
    JVar12 = (JSValue)(*pcVar3)(ctx_00,ctx_local,this_obj_local.u.float64,argc,pJVar6,local_2a4);
    ret_val.u = (JSValueUnion)JVar12.tag;
    arg_buf = (JSValue *)JVar12.u;
    pJVar9[-1].tag = 0x11d06d;
    iVar8 = JS_IsException(JVar12);
    JVar5.tag = (int64_t)ret_val.u.ptr;
    JVar5.u.ptr = arg_buf;
    JVar12.tag = (int64_t)ret_val.u.ptr;
    JVar12.u.ptr = arg_buf;
    if ((iVar8 == 0) && (JVar12 = JVar5, local_2a4[0] != 2)) {
      pJVar9[-1].tag = 0x11d09b;
      JVar12 = js_create_iterator_result
                         ((JSContext *)pJVar9[3].tag,pJVar9[4],*(BOOL *)((long)&pJVar9[3].u + 4));
    }
    break;
  default:
    pJVar9[-1].tag = 0x11d0cc;
    abort();
  }
  pJVar2->current_stack_frame = sf;
  return JVar12;
}

Assistant:

static JSValue js_call_c_function(JSContext *ctx, JSValueConst func_obj,
                                  JSValueConst this_obj,
                                  int argc, JSValueConst *argv, int flags)
{
    JSRuntime *rt = ctx->rt;
    JSCFunctionType func;
    JSObject *p;
    JSStackFrame sf_s, *sf = &sf_s, *prev_sf;
    JSValue ret_val;
    JSValueConst *arg_buf;
    int arg_count, i;
    JSCFunctionEnum cproto;

    p = JS_VALUE_GET_OBJ(func_obj);
    cproto = p->u.cfunc.cproto;
    arg_count = p->u.cfunc.length;

    /* better to always check stack overflow */
    if (js_check_stack_overflow(rt, sizeof(arg_buf[0]) * arg_count))
        return JS_ThrowStackOverflow(ctx);

    prev_sf = rt->current_stack_frame;
    sf->prev_frame = prev_sf;
    rt->current_stack_frame = sf;
    ctx = p->u.cfunc.realm; /* change the current realm */
    
#ifdef CONFIG_BIGNUM
    /* we only propagate the bignum mode as some runtime functions
       test it */
    if (prev_sf)
        sf->js_mode = prev_sf->js_mode & JS_MODE_MATH;
    else
        sf->js_mode = 0;
#else
    sf->js_mode = 0;
#endif
    sf->cur_func = (JSValue)func_obj;
    sf->arg_count = argc;
    arg_buf = argv;

    if (unlikely(argc < arg_count)) {
        /* ensure that at least argc_count arguments are readable */
        arg_buf = alloca(sizeof(arg_buf[0]) * arg_count);
        for(i = 0; i < argc; i++)
            arg_buf[i] = argv[i];
        for(i = argc; i < arg_count; i++)
            arg_buf[i] = JS_UNDEFINED;
        sf->arg_count = arg_count;
    }
    sf->arg_buf = (JSValue*)arg_buf;

    func = p->u.cfunc.c_function;
    switch(cproto) {
    case JS_CFUNC_constructor:
    case JS_CFUNC_constructor_or_func:
        if (!(flags & JS_CALL_FLAG_CONSTRUCTOR)) {
            if (cproto == JS_CFUNC_constructor) {
            not_a_constructor:
                ret_val = JS_ThrowTypeError(ctx, "must be called with new");
                break;
            } else {
                this_obj = JS_UNDEFINED;
            }
        }
        /* here this_obj is new_target */
        /* fall thru */
    case JS_CFUNC_generic:
        ret_val = func.generic(ctx, this_obj, argc, arg_buf);
        break;
    case JS_CFUNC_constructor_magic:
    case JS_CFUNC_constructor_or_func_magic:
        if (!(flags & JS_CALL_FLAG_CONSTRUCTOR)) {
            if (cproto == JS_CFUNC_constructor_magic) {
                goto not_a_constructor;
            } else {
                this_obj = JS_UNDEFINED;
            }
        }
        /* fall thru */
    case JS_CFUNC_generic_magic:
        ret_val = func.generic_magic(ctx, this_obj, argc, arg_buf,
                                     p->u.cfunc.magic);
        break;
    case JS_CFUNC_getter:
        ret_val = func.getter(ctx, this_obj);
        break;
    case JS_CFUNC_setter:
        ret_val = func.setter(ctx, this_obj, arg_buf[0]);
        break;
    case JS_CFUNC_getter_magic:
        ret_val = func.getter_magic(ctx, this_obj, p->u.cfunc.magic);
        break;
    case JS_CFUNC_setter_magic:
        ret_val = func.setter_magic(ctx, this_obj, arg_buf[0], p->u.cfunc.magic);
        break;
    case JS_CFUNC_f_f:
        {
            double d1;

            if (unlikely(JS_ToFloat64(ctx, &d1, arg_buf[0]))) {
                ret_val = JS_EXCEPTION;
                break;
            }
            ret_val = JS_NewFloat64(ctx, func.f_f(d1));
        }
        break;
    case JS_CFUNC_f_f_f:
        {
            double d1, d2;

            if (unlikely(JS_ToFloat64(ctx, &d1, arg_buf[0]))) {
                ret_val = JS_EXCEPTION;
                break;
            }
            if (unlikely(JS_ToFloat64(ctx, &d2, arg_buf[1]))) {
                ret_val = JS_EXCEPTION;
                break;
            }
            ret_val = JS_NewFloat64(ctx, func.f_f_f(d1, d2));
        }
        break;
    case JS_CFUNC_iterator_next:
        {
            int done;
            ret_val = func.iterator_next(ctx, this_obj, argc, arg_buf,
                                         &done, p->u.cfunc.magic);
            if (!JS_IsException(ret_val) && done != 2) {
                ret_val = js_create_iterator_result(ctx, ret_val, done);
            }
        }
        break;
    default:
        abort();
    }

    rt->current_stack_frame = sf->prev_frame;
    return ret_val;
}